

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::ByteSizeLong(VisionFeaturePrint *this)

{
  ulong uVar1;
  size_t sVar2;
  
  if (this->_oneof_case_[0] == 0x15) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects>
                      ((this->VisionFeaturePrintType_).objects_);
  }
  else {
    if (this->_oneof_case_[0] != 0x14) {
      sVar2 = 0;
      goto LAB_00251d8b;
    }
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene>
                      ((this->VisionFeaturePrintType_).scene_);
  }
  sVar2 = sVar2 + 2;
LAB_00251d8b:
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar2;
  return sVar2;
}

Assistant:

size_t VisionFeaturePrint::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (VisionFeaturePrintType_case()) {
    // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene scene = 20;
    case kScene: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *VisionFeaturePrintType_.scene_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects objects = 21;
    case kObjects: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *VisionFeaturePrintType_.objects_);
      break;
    }
    case VISIONFEATUREPRINTTYPE_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}